

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lp.cc
# Opt level: O0

double __thiscall fizplex::LP::get_value(LP *this,size_t row,size_t column)

{
  ColMatrix *pCVar1;
  size_t sVar2;
  ulong in_RDX;
  ColMatrix *in_RSI;
  size_t in_RDI;
  double dVar3;
  
  pCVar1 = (ColMatrix *)row_count((LP *)0x12affc);
  if (pCVar1 <= in_RSI) {
    __assert_fail("row < row_count()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/LeFiz[P]Fizplex/src/lp.cc"
                  ,0x47,"double fizplex::LP::get_value(size_t, size_t) const");
  }
  sVar2 = column_count((LP *)0x12b03e);
  if (in_RDX < sVar2) {
    dVar3 = ColMatrix::get_value(in_RSI,in_RDI,in_RDX);
    return dVar3;
  }
  __assert_fail("column < column_count()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/LeFiz[P]Fizplex/src/lp.cc",
                0x48,"double fizplex::LP::get_value(size_t, size_t) const");
}

Assistant:

double LP::get_value(size_t row, size_t column) const {
  assert(row < row_count());
  assert(column < column_count());

  return A.get_value(row, column);
}